

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void __thiscall deqp::gls::ub::UniformLayoutEntry::UniformLayoutEntry(UniformLayoutEntry *this)

{
  UniformLayoutEntry *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->type = TYPE_LAST;
  this->size = 0;
  this->blockNdx = -1;
  this->offset = -1;
  this->arrayStride = -1;
  this->matrixStride = -1;
  this->isRowMajor = false;
  return;
}

Assistant:

UniformLayoutEntry (void)
		: type			(glu::TYPE_LAST)
		, size			(0)
		, blockNdx		(-1)
		, offset		(-1)
		, arrayStride	(-1)
		, matrixStride	(-1)
		, isRowMajor	(false)
	{
	}